

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

void lzma_check_finish(lzma_check_state *check,lzma_check type)

{
  lzma_check type_local;
  lzma_check_state *check_local;
  
  if (type == LZMA_CHECK_CRC32) {
    (check->buffer).u32[0] = (check->state).crc32;
  }
  else if (type == LZMA_CHECK_CRC64) {
    (check->buffer).u64[0] = (check->state).crc64;
  }
  else if (type == LZMA_CHECK_SHA256) {
    lzma_sha256_finish(check);
  }
  return;
}

Assistant:

extern void
lzma_check_finish(lzma_check_state *check, lzma_check type)
{
	switch (type) {
#ifdef HAVE_CHECK_CRC32
	case LZMA_CHECK_CRC32:
		check->buffer.u32[0] = conv32le(check->state.crc32);
		break;
#endif

#ifdef HAVE_CHECK_CRC64
	case LZMA_CHECK_CRC64:
		check->buffer.u64[0] = conv64le(check->state.crc64);
		break;
#endif

#ifdef HAVE_CHECK_SHA256
	case LZMA_CHECK_SHA256:
		lzma_sha256_finish(check);
		break;
#endif

	default:
		break;
	}

	return;
}